

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::initsamplesize(aalcalc *this,string *path)

{
  bool bVar1;
  DIR *__dirp;
  dirent *pdVar2;
  FILE *__stream;
  string s;
  int summarycalcstream_type;
  
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      std::__cxx11::string::string((string *)&s,pdVar2->d_name,(allocator *)&summarycalcstream_type)
      ;
      if (4 < s._M_string_length) {
        std::__cxx11::string::substr((ulong)&summarycalcstream_type,(ulong)&s);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&summarycalcstream_type,".bin");
        std::__cxx11::string::~string((string *)&summarycalcstream_type);
        if (bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &summarycalcstream_type,path,pdVar2->d_name);
          std::__cxx11::string::operator=((string *)&s,(string *)&summarycalcstream_type);
          std::__cxx11::string::~string((string *)&summarycalcstream_type);
          __stream = fopen(s._M_dataplus._M_p,"rb");
          if (__stream != (FILE *)0x0) {
            summarycalcstream_type = 0;
            fread(&summarycalcstream_type,4,1,__stream);
            fread(&this->samplesize_,4,1,__stream);
            fclose(__stream);
            std::__cxx11::string::~string((string *)&s);
            return;
          }
          fprintf(_stderr,"FATAL:%s: cannot open %s\n","initsamplesize",s._M_dataplus._M_p);
          exit(1);
        }
      }
      std::__cxx11::string::~string((string *)&s);
    }
  }
  return;
}

Assistant:

void aalcalc::initsamplesize(const std::string &path)
{
	DIR *dir;
	struct dirent *ent;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				s = path + ent->d_name;
				FILE *fin = fopen(s.c_str(), "rb");
				if (fin == NULL) {
					fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, s.c_str());
					exit(EXIT_FAILURE);
				}
				int summarycalcstream_type = 0;
				fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
				fread(&samplesize_, sizeof(samplesize_), 1, fin);
				fclose(fin);
				break;
			}

		}
	}
}